

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall
GEO::Delaunay3dThread::Delaunay3dThread
          (Delaunay3dThread *this,ParallelDelaunay3d *master,index_t pool_begin,index_t pool_end)

{
  byte bVar1;
  index_t iVar2;
  double *pdVar3;
  uint *puVar4;
  double *local_78;
  uint local_30;
  index_t t;
  index_t pool_end_local;
  index_t pool_begin_local;
  ParallelDelaunay3d *master_local;
  Delaunay3dThread *this_local;
  
  Thread::Thread(&this->super_Thread);
  (this->super_Thread).super_Counted._vptr_Counted = (_func_int **)&PTR__Delaunay3dThread_002bb9f8;
  StellateConflictStack::StellateConflictStack(&this->S2_);
  this->master_ = master;
  this->cell_to_v_store_ = &this->master_->cell_to_v_store_;
  this->cell_to_cell_store_ = &this->master_->cell_to_cell_store_;
  this->cell_next_ = &this->master_->cell_next_;
  this->cell_thread_ = &this->master_->cell_thread_;
  vector<unsigned_int>::vector(&this->S_);
  vector<unsigned_int>::vector(&this->tets_to_delete_);
  vector<unsigned_int>::vector(&this->tets_to_release_);
  Cavity::Cavity(&this->cavity_);
  this->max_used_t_ = 1;
  iVar2 = vector<unsigned_int>::size(&this->master_->cell_next_);
  this->max_t_ = iVar2;
  iVar2 = Delaunay::nb_vertices(&this->master_->super_Delaunay);
  this->nb_vertices_ = iVar2;
  pdVar3 = Delaunay::vertex_ptr(&this->master_->super_Delaunay,0);
  this->vertices_ = pdVar3;
  this->weighted_ = (bool)(this->master_->weighted_ & 1);
  if ((this->weighted_ & 1U) == 0) {
    local_78 = (double *)0x0;
  }
  else {
    local_78 = vector<double>::data(&this->master_->heights_);
  }
  this->heights_ = local_78;
  bVar1 = Delaunay::dimension(&this->master_->super_Delaunay);
  this->dimension_ = (uint)bVar1;
  this->vertex_stride_ = this->dimension_;
  puVar4 = vector<unsigned_int>::data(&this->master_->reorder_);
  this->reorder_ = puVar4;
  this->first_free_ = pool_begin;
  for (local_30 = pool_begin; local_30 < pool_end - 1; local_30 = local_30 + 1) {
    puVar4 = vector<unsigned_int>::operator[](this->cell_next_,local_30);
    *puVar4 = local_30 + 1;
  }
  puVar4 = vector<unsigned_int>::operator[](this->cell_next_,pool_end - 1);
  *puVar4 = 0xffffffff;
  this->nb_free_ = pool_end - pool_begin;
  this->memory_overflow_ = false;
  this->work_begin_ = -1;
  this->work_end_ = -1;
  this->finished_ = false;
  this->b_hint_ = 0xffffffff;
  this->e_hint_ = 0xffffffff;
  this->direction_ = true;
  this->interfering_thread_ = 0xff;
  this->nb_rollbacks_ = 0;
  this->nb_failed_locate_ = 0;
  this->nb_tets_to_create_ = 0;
  this->t_boundary_ = 0xffffffff;
  this->f_boundary_ = 0xffffffff;
  this->v1_ = 0xffffffff;
  this->v2_ = 0xffffffff;
  this->v3_ = 0xffffffff;
  this->v4_ = 0xffffffff;
  pthread_cond_init((pthread_cond_t *)&this->cond_,(pthread_condattr_t *)0x0);
  pthread_mutex_init((pthread_mutex_t *)&this->mutex_,(pthread_mutexattr_t *)0x0);
  return;
}

Assistant:

Delaunay3dThread(
            ParallelDelaunay3d* master,
            index_t pool_begin,
            index_t pool_end
        ) : 
            master_(master),
            cell_to_v_store_(master_->cell_to_v_store_),
            cell_to_cell_store_(master_->cell_to_cell_store_),
            cell_next_(master_->cell_next_),
            cell_thread_(master_->cell_thread_)
        {

            // max_used_t_ is initialized to 1 so that
            // computing modulos does not trigger FPEs
            // at the beginning.
            max_used_t_ = 1;
            max_t_ = master_->cell_next_.size();

            nb_vertices_ = master_->nb_vertices();
            vertices_ = master_->vertex_ptr(0);
            weighted_ = master_->weighted_;
            heights_ = weighted_ ? master_->heights_.data() : nullptr;
            dimension_ = master_->dimension();
            vertex_stride_ = dimension_;
            reorder_ = master_->reorder_.data();

            // Initialize free list in memory pool
            first_free_ = pool_begin;
            for(index_t t=pool_begin; t<pool_end-1; ++t) {
                cell_next_[t] = t+1;
            }
            cell_next_[pool_end-1] = END_OF_LIST;
            nb_free_ = pool_end - pool_begin;
            memory_overflow_ = false;

            work_begin_ = -1;
            work_end_ = -1;
            finished_ = false;
            b_hint_ = NO_TETRAHEDRON;
            e_hint_ = NO_TETRAHEDRON;
            direction_ = true;

#ifdef GEO_DEBUG
            nb_acquired_tets_ = 0;
#endif
            interfering_thread_ = NO_THREAD;

            nb_rollbacks_ = 0;
            nb_failed_locate_ = 0;

            nb_tets_to_create_ = 0;
            t_boundary_ = NO_TETRAHEDRON;
            f_boundary_ = index_t(-1);

            v1_ = index_t(-1);
            v2_ = index_t(-1);
            v3_ = index_t(-1);
            v4_ = index_t(-1);

            pthread_cond_init(&cond_, nullptr);
            pthread_mutex_init(&mutex_, nullptr);
        }